

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::RangeSink::AddOutput(RangeSink *this,DualMap *map,NameMunger *munger)

{
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> local_10;
  
  local_10.first = map;
  local_10.second = munger;
  std::
  vector<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>,std::allocator<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>>>
  ::emplace_back<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>>
            ((vector<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>,std::allocator<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>>>
              *)&this->outputs_,&local_10);
  return;
}

Assistant:

void RangeSink::AddOutput(DualMap* map, const NameMunger* munger) {
  outputs_.push_back(std::make_pair(map, munger));
}